

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u32 XXH32_avalanche(xxh_u32 hash)

{
  uint uVar1;
  xxh_u32 hash_local;
  
  uVar1 = (hash >> 0xf ^ hash) * -0x7a143589;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51c3;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

static xxh_u32 XXH32_avalanche(xxh_u32 hash)
{
    hash ^= hash >> 15;
    hash *= XXH_PRIME32_2;
    hash ^= hash >> 13;
    hash *= XXH_PRIME32_3;
    hash ^= hash >> 16;
    return hash;
}